

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

bool wallet::DecryptKey(CKeyingMaterial *master_key,
                       span<const_unsigned_char,_18446744073709551615UL> crypted_secret,
                       CPubKey *pub_key,CKey *key)

{
  bool bVar1;
  CKeyingMaterial *in_R9;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext;
  CKeyingMaterial secret;
  undefined1 local_68 [8];
  uchar *puStack_60;
  pointer local_58;
  uint256 local_50;
  long local_30;
  
  ciphertext._M_ptr = crypted_secret._M_extent._M_extent_value;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (undefined1  [8])0x0;
  puStack_60 = (uchar *)0x0;
  local_58 = (pointer)0x0;
  CPubKey::GetHash(&local_50,pub_key);
  ciphertext._M_extent._M_extent_value = (size_t)&local_50;
  bVar1 = DecryptSecret((wallet *)master_key,(CKeyingMaterial *)crypted_secret._M_ptr,ciphertext,
                        (uint256 *)local_68,in_R9);
  if (bVar1) {
    if ((long)puStack_60 - (long)local_68 == 0x20) {
      CKey::
      Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>>
                (key,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                      )local_68,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                  )puStack_60,(pub_key->vch[0] & 0xfe) == 2);
      bVar1 = CKey::VerifyPubKey(key,pub_key);
      goto LAB_0090aa73;
    }
  }
  bVar1 = false;
LAB_0090aa73:
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DecryptKey(const CKeyingMaterial& master_key, const std::span<const unsigned char> crypted_secret, const CPubKey& pub_key, CKey& key)
{
    CKeyingMaterial secret;
    if (!DecryptSecret(master_key, crypted_secret, pub_key.GetHash(), secret)) {
        return false;
    }

    if (secret.size() != 32) {
        return false;
    }

    key.Set(secret.begin(), secret.end(), pub_key.IsCompressed());
    return key.VerifyPubKey(pub_key);
}